

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbirb.cpp
# Opt level: O2

RBBIDataHeader * __thiscall icu_63::RBBIRuleBuilder::flattenData(RBBIRuleBuilder *this)

{
  UnicodeString *rules;
  short sVar1;
  int32_t iVar2;
  uint uVar3;
  uint32_t uVar4;
  int iVar5;
  RBBIDataHeader *__s;
  uint uVar6;
  uint32_t uVar7;
  uint uVar8;
  uint32_t uVar9;
  long lVar10;
  uint uVar11;
  Char16Ptr local_b0;
  UnicodeString *local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  UnicodeString local_70;
  
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    rules = &this->fStrippedRules;
    RBBIRuleScanner::stripRules(&local_70,rules);
    UnicodeString::moveFrom(rules,&local_70);
    UnicodeString::~UnicodeString(&local_70);
    iVar2 = RBBITableBuilder::getTableSize(this->fForwardTable);
    uVar8 = iVar2 + 7U & 0xfffffff8;
    iVar2 = RBBITableBuilder::getSafeTableSize(this->fForwardTable);
    uVar11 = iVar2 + 7U & 0xfffffff8;
    iVar2 = RBBISetBuilder::getTrieSize(this->fSetBuilder);
    uVar6 = this->fRuleStatusVals->count * 4 + 7U & 0xfffffff8;
    local_98 = (ulong)uVar6;
    sVar1 = (this->fStrippedRules).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar5 = (this->fStrippedRules).fUnion.fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    uVar3 = iVar5 * 2 + 9U & 0xfffffff8;
    local_88 = (ulong)uVar3;
    uVar7 = uVar11 + uVar8 + 0x50;
    uVar9 = (iVar2 + 7U & 0xfffffff8) + uVar7;
    uVar6 = uVar9 + uVar6;
    local_90 = (ulong)uVar6;
    uVar4 = uVar3 + uVar6;
    local_a0 = (ulong)uVar11;
    __s = (RBBIDataHeader *)uprv_malloc_63((long)(int)uVar4);
    if (__s != (RBBIDataHeader *)0x0) {
      lVar10 = 0;
      local_a8 = rules;
      memset(__s,0,(long)(int)uVar4);
      __s->fMagic = 0xb1a0;
      __s->fFormatVersion[0] = '\x05';
      __s->fFormatVersion[1] = '\0';
      __s->fFormatVersion[2] = '\0';
      __s->fFormatVersion[3] = '\0';
      __s->fLength = uVar4;
      uVar4 = RBBISetBuilder::getNumCharCategories(this->fSetBuilder);
      __s->fCatCount = uVar4;
      __s->fFTable = 0x50;
      __s->fFTableLen = uVar8;
      __s->fRTable = uVar8 + 0x50;
      __s->fRTableLen = (uint32_t)local_a0;
      __s->fTrie = uVar7;
      uVar4 = RBBISetBuilder::getTrieSize(this->fSetBuilder);
      __s->fTrieLen = uVar4;
      __s->fStatusTable = uVar9;
      __s->fStatusTableLen = (uint32_t)local_98;
      __s->fRuleSource = (uint32_t)local_90;
      sVar1 = (this->fStrippedRules).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar5 = (this->fStrippedRules).fUnion.fFields.fLength;
      }
      else {
        iVar5 = (int)sVar1 >> 5;
      }
      __s->fRuleSourceLen = iVar5 * 2;
      __s->fReserved[4] = 0;
      __s->fReserved[5] = 0;
      __s->fReserved[0] = 0;
      __s->fReserved[1] = 0;
      __s->fReserved[2] = 0;
      __s->fReserved[3] = 0;
      RBBITableBuilder::exportTable(this->fForwardTable,__s + 1);
      RBBITableBuilder::exportSafeTable
                (this->fForwardTable,__s->fFormatVersion + ((ulong)__s->fRTable - 4));
      RBBISetBuilder::serializeTrie(this->fSetBuilder,__s->fFormatVersion + ((ulong)__s->fTrie - 4))
      ;
      uVar6 = __s->fStatusTable;
      for (; lVar10 < this->fRuleStatusVals->count; lVar10 = lVar10 + 1) {
        iVar2 = UVector::elementAti(this->fRuleStatusVals,(int32_t)lVar10);
        *(int32_t *)(__s->fFormatVersion + lVar10 * 4 + (ulong)uVar6 + -4) = iVar2;
      }
      local_b0.p_ = (char16_t *)(__s->fFormatVersion + ((ulong)__s->fRuleSource - 4));
      UnicodeString::extract(local_a8,&local_b0,(int)local_88 >> 1 | 1,this->fStatus);
      return __s;
    }
    *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
  }
  return (RBBIDataHeader *)0x0;
}

Assistant:

RBBIDataHeader *RBBIRuleBuilder::flattenData() {
    int32_t    i;

    if (U_FAILURE(*fStatus)) {
        return NULL;
    }

    // Remove whitespace from the rules to make it smaller.
    // The rule parser has already removed comments.
    fStrippedRules = fScanner->stripRules(fStrippedRules);

    // Calculate the size of each section in the data.
    //   Sizes here are padded up to a multiple of 8 for better memory alignment.
    //   Sections sizes actually stored in the header are for the actual data
    //     without the padding.
    //
    int32_t headerSize        = align8(sizeof(RBBIDataHeader));
    int32_t forwardTableSize  = align8(fForwardTable->getTableSize());
    int32_t reverseTableSize  = align8(fForwardTable->getSafeTableSize());
    int32_t trieSize          = align8(fSetBuilder->getTrieSize());
    int32_t statusTableSize   = align8(fRuleStatusVals->size() * sizeof(int32_t));
    int32_t rulesSize         = align8((fStrippedRules.length()+1) * sizeof(UChar));

    int32_t         totalSize = headerSize
                                + forwardTableSize
                                + reverseTableSize
                                + statusTableSize + trieSize + rulesSize;

    RBBIDataHeader  *data     = (RBBIDataHeader *)uprv_malloc(totalSize);
    if (data == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    uprv_memset(data, 0, totalSize);


    data->fMagic            = 0xb1a0;
    data->fFormatVersion[0] = RBBI_DATA_FORMAT_VERSION[0];
    data->fFormatVersion[1] = RBBI_DATA_FORMAT_VERSION[1];
    data->fFormatVersion[2] = RBBI_DATA_FORMAT_VERSION[2];
    data->fFormatVersion[3] = RBBI_DATA_FORMAT_VERSION[3];
    data->fLength           = totalSize;
    data->fCatCount         = fSetBuilder->getNumCharCategories();

    data->fFTable        = headerSize;
    data->fFTableLen     = forwardTableSize;

    data->fRTable        = data->fFTable  + data->fFTableLen;
    data->fRTableLen     = reverseTableSize;

    data->fTrie          = data->fRTable + data->fRTableLen;
    data->fTrieLen       = fSetBuilder->getTrieSize();
    data->fStatusTable   = data->fTrie    + trieSize;
    data->fStatusTableLen= statusTableSize;
    data->fRuleSource    = data->fStatusTable + statusTableSize;
    data->fRuleSourceLen = fStrippedRules.length() * sizeof(UChar);

    uprv_memset(data->fReserved, 0, sizeof(data->fReserved));

    fForwardTable->exportTable((uint8_t *)data + data->fFTable);
    fForwardTable->exportSafeTable((uint8_t *)data + data->fRTable);
    fSetBuilder->serializeTrie ((uint8_t *)data + data->fTrie);

    int32_t *ruleStatusTable = (int32_t *)((uint8_t *)data + data->fStatusTable);
    for (i=0; i<fRuleStatusVals->size(); i++) {
        ruleStatusTable[i] = fRuleStatusVals->elementAti(i);
    }

    fStrippedRules.extract((UChar *)((uint8_t *)data+data->fRuleSource), rulesSize/2+1, *fStatus);

    return data;
}